

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::EnforceCommentStyle::fixComment
          (EnforceCommentStyle *this,string *s,bool preserve_hash)

{
  char *pcVar1;
  char cVar2;
  long *plVar3;
  long *plVar4;
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  cVar2 = (this->super_FmtPass).opts.commentStyle;
  if (cVar2 == 'h') {
    if (*(s->_M_dataplus)._M_p != '/') {
      return;
    }
    std::__cxx11::string::substr((ulong)local_68,(ulong)s);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x20cba4);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_38 = *plVar4;
      lStack_30 = plVar3[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar4;
      local_48 = (long *)*plVar3;
    }
    local_40 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)s,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    cVar2 = (this->super_FmtPass).opts.commentStyle;
  }
  if (((cVar2 == 's') && (pcVar1 = (s->_M_dataplus)._M_p, *pcVar1 == '#')) &&
     ((!preserve_hash || (pcVar1[1] != '!')))) {
    std::__cxx11::string::substr((ulong)local_68,(ulong)s);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x20b620);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_38 = *plVar4;
      lStack_30 = plVar3[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar4;
      local_48 = (long *)*plVar3;
    }
    local_40 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)s,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
  }
  return;
}

Assistant:

void fixComment(std::string &s, bool preserve_hash)
    {
        if (opts.commentStyle == 'h' && s[0] == '/') {
            s = "#" + s.substr(2);
        }
        if (opts.commentStyle == 's' && s[0] == '#') {
            if (preserve_hash && s[1] == '!')
                return;
            s = "//" + s.substr(1);
        }
    }